

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O2

void __thiscall QColumnViewGrip::mousePressEvent(QColumnViewGrip *this,QMouseEvent *event)

{
  long lVar1;
  QPoint QVar2;
  long in_FS_OFFSET;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_28 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
  QVar2 = QPointF::toPoint(&local_28);
  *(int *)(lVar1 + 0x254) = QVar2.xp.m_i.m_i;
  event[0xc] = (QMouseEvent)0x1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewGrip::mousePressEvent(QMouseEvent *event)
{
    Q_D(QColumnViewGrip);
    d->originalXLocation = event->globalPosition().toPoint().x();
    event->accept();
}